

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O0

int tcb::unicode::detail::utf_traits<char,_1>::width(code_point value)

{
  undefined4 local_c;
  code_point value_local;
  
  if ((uint)value < 0x80) {
    local_c = 1;
  }
  else if ((uint)value < 0x800) {
    local_c = 2;
  }
  else if ((uint)value < 0x10000) {
    local_c = 3;
  }
  else {
    local_c = 4;
  }
  return local_c;
}

Assistant:

static TCB_CONSTEXPR14 int width(code_point value)
    {
        if (value <= 0x7F) {
            return 1;
        }
        else if (value <= 0x7FF) {
            return 2;
        }
        else if (TCB_LIKELY(value <= 0xFFFF)) {
            return 3;
        }
        else {
            return 4;
        }
    }